

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zeModuleInspectLinkageExt
          (ze_linkage_inspection_ext_desc_t *pInspectDesc,uint32_t numModules,
          ze_module_handle_t *phModules,ze_module_build_log_handle_t *phLog)

{
  ze_pfnModuleInspectLinkageExt_t p_Var1;
  ze_result_t zVar2;
  ze_module_handle_t *pp_Var3;
  ulong uVar4;
  object_t<_ze_module_build_log_handle_t_*> *poVar5;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(*phModules + 8);
  p_Var1 = (local_38->ze).Module.pfnInspectLinkageExt;
  if (p_Var1 == (ze_pfnModuleInspectLinkageExt_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pp_Var3 = (ze_module_handle_t *)operator_new__((ulong)numModules * 8);
    if (numModules != 0) {
      uVar4 = 0;
      do {
        pp_Var3[uVar4] = *(ze_module_handle_t *)phModules[uVar4];
        uVar4 = uVar4 + 1;
      } while (numModules != uVar4);
    }
    zVar2 = (*p_Var1)(pInspectDesc,numModules,pp_Var3,phLog);
    operator_delete__(pp_Var3);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar5 = singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
               ::getInstance<_ze_module_build_log_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_module_build_log_handle_t*>,_ze_module_build_log_handle_t*>
                           *)(context + 0x4e0),phLog,&local_38);
      *phLog = (ze_module_build_log_handle_t)poVar5;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleInspectLinkageExt(
        ze_linkage_inspection_ext_desc_t* pInspectDesc, ///< [in] pointer to linkage inspection descriptor structure.
        uint32_t numModules,                            ///< [in] number of modules to be inspected pointed to by phModules.
        ze_module_handle_t* phModules,                  ///< [in][range(0, numModules)] pointer to an array of modules to be
                                                        ///< inspected for import dependencies.
        ze_module_build_log_handle_t* phLog             ///< [out] pointer to handle of linkage inspection log. Log object will
                                                        ///< contain separate lists of imports, un-resolvable imports, and exports.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( phModules[ 0 ] )->dditable;
        auto pfnInspectLinkageExt = dditable->ze.Module.pfnInspectLinkageExt;
        if( nullptr == pfnInspectLinkageExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handles to driver handles
        auto phModulesLocal = new ze_module_handle_t [numModules];
        for( size_t i = 0; ( nullptr != phModules ) && ( i < numModules ); ++i )
            phModulesLocal[ i ] = reinterpret_cast<ze_module_object_t*>( phModules[ i ] )->handle;

        // forward to device-driver
        result = pfnInspectLinkageExt( pInspectDesc, numModules, phModulesLocal, phLog );
        delete []phModulesLocal;

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phLog = reinterpret_cast<ze_module_build_log_handle_t>(
                context->ze_module_build_log_factory.getInstance( *phLog, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }